

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLExporter.cpp
# Opt level: O0

void __thiscall Assimp::STLExporter::WriteMesh(STLExporter *this,aiMesh *m)

{
  ostream *poVar1;
  aiVector3D *paVar2;
  aiVector3D *v;
  uint local_38;
  uint a_1;
  uint a;
  aiVector3D nor;
  aiFace *f;
  uint i;
  aiMesh *m_local;
  STLExporter *this_local;
  
  for (f._4_4_ = 0; f._4_4_ < m->mNumFaces; f._4_4_ = f._4_4_ + 1) {
    nor._4_8_ = m->mFaces + f._4_4_;
    aiVector3t<float>::aiVector3t((aiVector3t<float> *)&a_1);
    if (m->mNormals != (aiVector3D *)0x0) {
      for (local_38 = 0; local_38 < *(uint *)nor._4_8_; local_38 = local_38 + 1) {
        aiVector3t<float>::operator+=
                  ((aiVector3t<float> *)&a_1,
                   m->mNormals + *(uint *)(*(long *)(nor._4_8_ + 8) + (ulong)local_38 * 4));
      }
      aiVector3t<float>::NormalizeSafe((aiVector3t<float> *)&a_1);
    }
    poVar1 = std::operator<<((ostream *)this," facet normal ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)a_1);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)a);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,nor.x);
    std::operator<<(poVar1,(string *)&this->endl);
    poVar1 = std::operator<<((ostream *)this,"  outer loop");
    std::operator<<(poVar1,(string *)&this->endl);
    for (v._4_4_ = 0; v._4_4_ < *(uint *)nor._4_8_; v._4_4_ = v._4_4_ + 1) {
      paVar2 = m->mVertices + *(uint *)(*(long *)(nor._4_8_ + 8) + (ulong)v._4_4_ * 4);
      poVar1 = std::operator<<((ostream *)this,"  vertex ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,paVar2->x);
      poVar1 = std::operator<<(poVar1," ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,paVar2->y);
      poVar1 = std::operator<<(poVar1," ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,paVar2->z);
      std::operator<<(poVar1,(string *)&this->endl);
    }
    poVar1 = std::operator<<((ostream *)this,"  endloop");
    std::operator<<(poVar1,(string *)&this->endl);
    poVar1 = std::operator<<((ostream *)this," endfacet");
    poVar1 = std::operator<<(poVar1,(string *)&this->endl);
    std::operator<<(poVar1,(string *)&this->endl);
  }
  return;
}

Assistant:

void STLExporter::WriteMesh(const aiMesh* m)
{
    for (unsigned int i = 0; i < m->mNumFaces; ++i) {
        const aiFace& f = m->mFaces[i];

        // we need per-face normals. We specified aiProcess_GenNormals as pre-requisite for this exporter,
        // but nonetheless we have to expect per-vertex normals.
        aiVector3D nor;
        if (m->mNormals) {
            for(unsigned int a = 0; a < f.mNumIndices; ++a) {
                nor += m->mNormals[f.mIndices[a]];
            }
            nor.NormalizeSafe();
        }
        mOutput << " facet normal " << nor.x << " " << nor.y << " " << nor.z << endl;
        mOutput << "  outer loop" << endl;
        for(unsigned int a = 0; a < f.mNumIndices; ++a) {
            const aiVector3D& v  = m->mVertices[f.mIndices[a]];
            mOutput << "  vertex " << v.x << " " << v.y << " " << v.z << endl;
        }

        mOutput << "  endloop" << endl;
        mOutput << " endfacet" << endl << endl;
    }
}